

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O1

void __thiscall HEkkDual::chooseColumnSlice(HEkkDual *this,HVector *row_ep)

{
  uint32_t *puVar1;
  HEkkDualRow *this_00;
  HighsInt *pHVar2;
  __atomic_base<int> _Var3;
  uint uVar4;
  uint32_t uVar5;
  HighsSimplexAnalysis *this_01;
  HighsSplitDeque *pHVar6;
  element_type *peVar7;
  bool bVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  HighsInt HVar12;
  HighsTask *pHVar13;
  uint start;
  long lVar14;
  double dVar15;
  pair<HighsSplitDeque::Status,_HighsTask_*> pVar16;
  bool use_row_price_w_switch;
  bool use_col_price;
  bool local_72;
  bool local_71;
  HVector *local_70;
  long *local_68;
  TaskGroup local_60;
  anon_class_32_4_b1b9b1f6 local_50;
  
  if (this->rebuild_reason == 0) {
    local_70 = row_ep;
    HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x2e,0);
    this_00 = &this->dualRow;
    HEkkDualRow::clear(this_00);
    (this->dualRow).workDelta = this->delta_primal;
    HEkkDualRow::createFreemove(this_00,local_70);
    HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x2e,0);
    HEkk::choosePriceTechnique
              (this->ekk_instance_,(this->ekk_instance_->info_).price_strategy,
               (double)local_70->count * this->inv_solver_num_row,&local_71,&local_72);
    this_01 = this->analysis;
    if (this_01->analyse_simplex_summary_data == true) {
      if (local_71 == true) {
        HighsSimplexAnalysis::operationRecordBefore(this_01,5,local_70->count,0.0);
        pHVar2 = &this->analysis->num_col_price;
        *pHVar2 = *pHVar2 + 1;
      }
      else {
        HighsSimplexAnalysis::operationRecordBefore
                  (this_01,5,local_70->count,(this->ekk_instance_->info_).row_ep_density);
        if (local_72 == true) {
          pHVar2 = &this->analysis->num_row_price_with_switch;
          *pHVar2 = *pHVar2 + 1;
        }
        else {
          pHVar2 = &this->analysis->num_row_price;
          *pHVar2 = *pHVar2 + 1;
        }
      }
    }
    HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x2f,0);
    HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
    local_68 = (long *)__tls_get_addr(&PTR_00449ef0);
    pHVar6 = (HighsSplitDeque *)*local_68;
    uVar9 = (pHVar6->ownerData).head;
    uVar10 = (ulong)uVar9;
    if (uVar10 < 0x2000) {
      (pHVar6->ownerData).head = uVar9 + 1;
      (pHVar6->taskArray)._M_elems[uVar10].metadata.stealer.super___atomic_base<unsigned_long>._M_i
           = 0;
      *(undefined ***)(pHVar6->taskArray)._M_elems[uVar10].taskData = &PTR_operator___00449310;
      *(HEkkDual **)((pHVar6->taskArray)._M_elems[uVar10].taskData + 8) = this;
      *(HVector ***)((pHVar6->taskArray)._M_elems[uVar10].taskData + 0x10) = &local_70;
      if ((pHVar6->ownerData).allStolenCopy == true) {
        uVar5 = (pHVar6->ownerData).head;
        (pHVar6->stealerData).ts.super___atomic_base<unsigned_long>._M_i = CONCAT44(uVar5 - 1,uVar5)
        ;
        (pHVar6->stealerData).allStolen._M_base._M_i = false;
        (pHVar6->ownerData).splitCopy = (pHVar6->ownerData).head;
        (pHVar6->ownerData).allStolenCopy = false;
        if (((pHVar6->splitRequest)._M_base._M_i & 1U) != 0) {
          (pHVar6->splitRequest)._M_base._M_i = false;
        }
        peVar7 = (pHVar6->ownerData).workerBunk.
                 super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        LOCK();
        _Var3._M_i = (peVar7->haveJobs).super___atomic_base<int>._M_i;
        (peVar7->haveJobs).super___atomic_base<int>._M_i =
             (peVar7->haveJobs).super___atomic_base<int>._M_i + 1;
        UNLOCK();
        if (_Var3._M_i < (pHVar6->ownerData).numWorkers + -1) {
          HighsSplitDeque::WorkerBunk::publishWork
                    ((pHVar6->ownerData).workerBunk.
                     super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,pHVar6);
        }
      }
      else {
        HighsSplitDeque::growShared(pHVar6);
      }
    }
    else {
      if (((pHVar6->ownerData).splitCopy < 0x2000) && ((pHVar6->ownerData).allStolenCopy == false))
      {
        HighsSplitDeque::growShared(pHVar6);
      }
      puVar1 = &(pHVar6->ownerData).head;
      *puVar1 = *puVar1 + 1;
      HEkkDualRow::chooseMakepack(this_00,local_70,this->solver_num_col);
      HEkkDualRow::choosePossible(this_00);
    }
    uVar9 = this->slice_num;
    local_50.row_ep = &local_70;
    local_50.this = this;
    local_50.use_col_price = &local_71;
    local_50.use_row_price_w_switch = &local_72;
    if ((int)uVar9 < 2) {
      chooseColumnSlice::anon_class_32_4_b1b9b1f6::operator()(&local_50,0,uVar9);
    }
    else {
      HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
      local_60.workerDeque = (HighsSplitDeque *)*local_68;
      local_60.dequeHead = ((local_60.workerDeque)->ownerData).head;
      do {
        pHVar6 = local_60.workerDeque;
        start = uVar9 >> 1;
        uVar4 = ((local_60.workerDeque)->ownerData).head;
        uVar10 = (ulong)uVar4;
        if (uVar10 < 0x2000) {
          ((local_60.workerDeque)->ownerData).head = uVar4 + 1;
          ((local_60.workerDeque)->taskArray)._M_elems[uVar10].metadata.stealer.
          super___atomic_base<unsigned_long>._M_i = 0;
          *(undefined ***)((local_60.workerDeque)->taskArray)._M_elems[uVar10].taskData =
               &PTR_operator___00449370;
          *(uint *)(((local_60.workerDeque)->taskArray)._M_elems[uVar10].taskData + 8) = start;
          *(uint *)(((local_60.workerDeque)->taskArray)._M_elems[uVar10].taskData + 0xc) = uVar9;
          pHVar13 = ((local_60.workerDeque)->taskArray)._M_elems + uVar10;
          pHVar13->taskData[0x10] = '\x01';
          pHVar13->taskData[0x11] = '\0';
          pHVar13->taskData[0x12] = '\0';
          pHVar13->taskData[0x13] = '\0';
          *(anon_class_32_4_b1b9b1f6 **)
           (((local_60.workerDeque)->taskArray)._M_elems[uVar10].taskData + 0x18) = &local_50;
          if (((local_60.workerDeque)->ownerData).allStolenCopy == true) {
            uVar5 = ((local_60.workerDeque)->ownerData).head;
            ((local_60.workerDeque)->stealerData).ts.super___atomic_base<unsigned_long>._M_i =
                 CONCAT44(uVar5 - 1,uVar5);
            ((local_60.workerDeque)->stealerData).allStolen._M_base._M_i = false;
            ((local_60.workerDeque)->ownerData).splitCopy = ((local_60.workerDeque)->ownerData).head
            ;
            ((local_60.workerDeque)->ownerData).allStolenCopy = false;
            if ((((local_60.workerDeque)->splitRequest)._M_base._M_i & 1U) != 0) {
              ((local_60.workerDeque)->splitRequest)._M_base._M_i = false;
            }
            peVar7 = ((local_60.workerDeque)->ownerData).workerBunk.
                     super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            LOCK();
            _Var3._M_i = (peVar7->haveJobs).super___atomic_base<int>._M_i;
            (peVar7->haveJobs).super___atomic_base<int>._M_i =
                 (peVar7->haveJobs).super___atomic_base<int>._M_i + 1;
            UNLOCK();
            if (_Var3._M_i < ((local_60.workerDeque)->ownerData).numWorkers + -1) {
              HighsSplitDeque::WorkerBunk::publishWork
                        (((local_60.workerDeque)->ownerData).workerBunk.
                         super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,local_60.workerDeque);
            }
          }
          else {
            HighsSplitDeque::growShared(local_60.workerDeque);
          }
        }
        else {
          if ((((local_60.workerDeque)->ownerData).splitCopy < 0x2000) &&
             (((local_60.workerDeque)->ownerData).allStolenCopy == false)) {
            HighsSplitDeque::growShared(local_60.workerDeque);
          }
          puVar1 = &(pHVar6->ownerData).head;
          *puVar1 = *puVar1 + 1;
          ::highs::parallel::for_each<HEkkDual::chooseColumnSlice(HVectorBase<double>*)::__1&>
                    (start,uVar9,&local_50,1);
        }
        bVar8 = 3 < uVar9;
        uVar9 = start;
      } while (bVar8);
      chooseColumnSlice::anon_class_32_4_b1b9b1f6::operator()(&local_50,0,start);
      ::highs::parallel::TaskGroup::taskWait(&local_60);
      ::highs::parallel::TaskGroup::~TaskGroup(&local_60);
    }
    HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
    pHVar6 = (HighsSplitDeque *)*local_68;
    pVar16 = HighsSplitDeque::pop(pHVar6);
    pHVar13 = pVar16.second;
    if (pVar16.first == kWork) {
      if ((pHVar13->metadata).stealer.super___atomic_base<unsigned_long>._M_i == 0) {
        (*(code *)**(undefined8 **)pHVar13->taskData)(pHVar13);
      }
    }
    else if (pVar16.first == kStolen) {
      HighsTaskExecutor::sync_stolen_task(pHVar6,pHVar13);
    }
    if (this->analysis->analyse_simplex_summary_data == true) {
      if ((long)this->slice_num < 1) {
        HVar12 = 0;
      }
      else {
        lVar11 = 0;
        HVar12 = 0;
        do {
          HVar12 = HVar12 + *(int *)((long)&this->slice_row_ap[0].count + lVar11);
          lVar11 = lVar11 + 0xb0;
        } while ((long)this->slice_num * 0xb0 - lVar11 != 0);
      }
      HighsSimplexAnalysis::operationRecordAfter(this->analysis,5,HVar12);
    }
    if (0 < this->slice_num) {
      lVar14 = 0;
      lVar11 = 0;
      do {
        HEkkDualRow::chooseJoinpack
                  (this_00,(HEkkDualRow *)
                           ((long)&((this->slice_dualRow).
                                    super__Vector_base<HEkkDualRow,_std::allocator<HEkkDualRow>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->ekk_instance_ +
                           lVar14));
        lVar11 = lVar11 + 1;
        lVar14 = lVar14 + 0x150;
      } while (lVar11 < this->slice_num);
    }
    HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x2f,0);
    this->variable_in = -1;
    if (((this->dualRow).workTheta <= 0.0) || ((this->dualRow).workCount == 0)) {
      this->rebuild_reason = 6;
    }
    else {
      HVar12 = HEkkDualRow::chooseFinal(this_00);
      if (HVar12 == 0) {
        if ((this->slice_num == 0) &&
           (uVar9 = HEkkDualRow::debugChooseColumnInfeasibilities(this_00), uVar9 != 0)) {
          highsLogDev(&(this->ekk_instance_->options_->super_HighsOptionsStruct).log_options,kError,
                      "chooseFinal would create %d dual infeasibilities\n",(ulong)uVar9);
          HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x38,0);
          this->rebuild_reason = 9;
        }
        else {
          HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x3a,0);
          HEkkDualRow::deleteFreemove(this_00);
          HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x3a,0);
          this->variable_in = (this->dualRow).workPivot;
          this->alpha_row = (this->dualRow).workAlpha;
          this->theta_dual = (this->dualRow).workTheta;
          if ((this->edge_weight_mode == kDevex) && (this->new_devex_framework == false)) {
            HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x3b,0);
            HEkkDualRow::computeDevexWeight(this_00,-1);
            uVar9 = this->slice_num;
            if (0 < (int)uVar9) {
              lVar14 = 0;
              lVar11 = 0;
              do {
                HEkkDualRow::computeDevexWeight
                          ((HEkkDualRow *)
                           ((long)&((this->slice_dualRow).
                                    super__Vector_base<HEkkDualRow,_std::allocator<HEkkDualRow>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->ekk_instance_ +
                           lVar14),(HighsInt)lVar11);
                lVar11 = lVar11 + 1;
                uVar9 = this->slice_num;
                lVar14 = lVar14 + 0x150;
              } while (lVar11 < (int)uVar9);
            }
            this->computed_edge_weight = (this->dualRow).computed_edge_weight;
            if (0 < (int)uVar9) {
              dVar15 = this->computed_edge_weight;
              lVar11 = 0;
              do {
                dVar15 = dVar15 + *(double *)
                                   ((long)&((this->slice_dualRow).
                                            super__Vector_base<HEkkDualRow,_std::allocator<HEkkDualRow>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                           computed_edge_weight + lVar11);
                lVar11 = lVar11 + 0x150;
              } while ((ulong)uVar9 * 0x150 - lVar11 != 0);
              this->computed_edge_weight = dVar15;
            }
            dVar15 = this->computed_edge_weight;
            if (dVar15 <= 1.0) {
              dVar15 = 1.0;
            }
            this->computed_edge_weight = dVar15;
            HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x3b,0);
          }
        }
      }
      else {
        this->rebuild_reason = (HVar12 >> 0x1f) * -3 + 6;
      }
    }
  }
  return;
}

Assistant:

void HEkkDual::chooseColumnSlice(HVector* row_ep) {
  // Choose the index of a column to enter the basis (CHUZC) by
  // exploiting slices of the pivotal row - for SIP and PAMI
  //
  // If reinversion is needed then skip this method
  if (rebuild_reason) return;

  analysis->simplexTimerStart(Chuzc0Clock);
  dualRow.clear();
  dualRow.workDelta = delta_primal;
  dualRow.createFreemove(row_ep);
  analysis->simplexTimerStop(Chuzc0Clock);

  //  const HighsInt solver_num_row = ekk_instance_.lp_.num_row_;
  const double local_density = 1.0 * row_ep->count * inv_solver_num_row;
  bool use_col_price;
  bool use_row_price_w_switch;
  HighsSimplexInfo& info = ekk_instance_.info_;
  ekk_instance_.choosePriceTechnique(info.price_strategy, local_density,
                                     use_col_price, use_row_price_w_switch);

  if (analysis->analyse_simplex_summary_data) {
    const HighsInt row_ep_count = row_ep->count;
    if (use_col_price) {
      analysis->operationRecordBefore(kSimplexNlaPriceAp, row_ep_count, 0.0);
      analysis->num_col_price++;
    } else if (use_row_price_w_switch) {
      analysis->operationRecordBefore(kSimplexNlaPriceAp, row_ep_count,
                                      ekk_instance_.info_.row_ep_density);
      analysis->num_row_price_with_switch++;
    } else {
      analysis->operationRecordBefore(kSimplexNlaPriceAp, row_ep_count,
                                      ekk_instance_.info_.row_ep_density);
      analysis->num_row_price++;
    }
  }
  analysis->simplexTimerStart(PriceChuzc1Clock);
  // Row_ep:         PACK + CC1

  highs::parallel::spawn([&]() {
    dualRow.chooseMakepack(row_ep, solver_num_col);
    dualRow.choosePossible();
  });

  // Row_ap: PRICE + PACK + CC1
  highs::parallel::for_each(0, slice_num, [&](HighsInt start, HighsInt end) {
    const bool quad_precision = false;
    for (HighsInt i = start; i < end; i++) {
      slice_row_ap[i].clear();

      if (use_col_price) {
        // Perform column-wise PRICE
        slice_a_matrix[i].priceByColumn(quad_precision, slice_row_ap[i],
                                        *row_ep);
      } else if (use_row_price_w_switch) {
        // Perform hyper-sparse row-wise PRICE, but switch if the density of
        // row_ap becomes extreme
        slice_ar_matrix[i].priceByRowWithSwitch(
            quad_precision, slice_row_ap[i], *row_ep,
            ekk_instance_.info_.row_ap_density, 0, kHyperPriceDensity);
      } else {
        // Perform hyper-sparse row-wise PRICE
        slice_ar_matrix[i].priceByRow(quad_precision, slice_row_ap[i], *row_ep);
      }

      slice_dualRow[i].clear();
      slice_dualRow[i].workDelta = delta_primal;
      slice_dualRow[i].chooseMakepack(&slice_row_ap[i], slice_start[i]);
      slice_dualRow[i].choosePossible();
    }
  });

  highs::parallel::sync();

  if (analysis->analyse_simplex_summary_data) {
    // Determine the nonzero count of the whole row
    HighsInt row_ap_count = 0;
    for (HighsInt i = 0; i < slice_num; i++)
      row_ap_count += slice_row_ap[i].count;
    analysis->operationRecordAfter(kSimplexNlaPriceAp, row_ap_count);
  }

  // Join CC1 results here
  for (HighsInt i = 0; i < slice_num; i++) {
    dualRow.chooseJoinpack(&slice_dualRow[i]);
  }

  analysis->simplexTimerStop(PriceChuzc1Clock);

  // Infeasible we created before
  variable_in = -1;
  if (dualRow.workTheta <= 0 || dualRow.workCount == 0) {
    rebuild_reason = kRebuildReasonPossiblyDualUnbounded;
    return;
  }

  // Choose column 2, This only happens if didn't go out
  HighsInt return_code = dualRow.chooseFinal();
  if (return_code) {
    // Only returns -1, if not zero
    assert(return_code == -1);
    if (return_code < 0) {
      rebuild_reason = kRebuildReasonChooseColumnFail;
    } else {
      rebuild_reason = kRebuildReasonPossiblyDualUnbounded;
    }
    return;
  }

  if (slice_num == 0) {
    // This check is only done for serial code - since packIndex/Value
    // is distributed
    HighsInt num_infeasibility = dualRow.debugChooseColumnInfeasibilities();
    if (num_infeasibility) {
      highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kError,
                  "chooseFinal would create %d dual infeasibilities\n",
                  (int)num_infeasibility);
      analysis->simplexTimerStop(Chuzc4dClock);
      rebuild_reason = kRebuildReasonChooseColumnFail;
      return;
    }
  }

  analysis->simplexTimerStart(Chuzc5Clock);
  dualRow.deleteFreemove();
  analysis->simplexTimerStop(Chuzc5Clock);

  variable_in = dualRow.workPivot;
  alpha_row = dualRow.workAlpha;
  theta_dual = dualRow.workTheta;

  if (edge_weight_mode == EdgeWeightMode::kDevex && !new_devex_framework) {
    // When using Devex, unless a new framework is to be used, get the
    // exact weight for the pivotal row and, based on its accuracy,
    // determine that a new framework is to be used. In serial
    // new_devex_framework should only ever be false at this point in
    // this method, but in PAMI, this method may be called multiple
    // times in minor iterations and the new framework is set up in
    // majorUpdate.
    analysis->simplexTimerStart(DevexWtClock);
    // Determine the partial sums of the exact Devex weight
    // First the partial sum for row_ep
    dualRow.computeDevexWeight();
    // Second the partial sums for the slices of row_ap
    for (HighsInt i = 0; i < slice_num; i++)
      slice_dualRow[i].computeDevexWeight(i);
    // Accumulate the partial sums
    // Initialise with the partial sum for row_ep
    computed_edge_weight = dualRow.computed_edge_weight;
    // Update with the partial sum for row_ep
    for (HighsInt i = 0; i < slice_num; i++)
      computed_edge_weight += slice_dualRow[i].computed_edge_weight;
    computed_edge_weight = max(1.0, computed_edge_weight);
    analysis->simplexTimerStop(DevexWtClock);
  }
}